

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImDrawDataBuilder::ClearFreeMemory(ImDrawDataBuilder *this)

{
  int *piVar1;
  void *pvVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    pvVar2 = *(void **)((long)&this->Layers[0].Data + lVar3);
    if (pvVar2 != (void *)0x0) {
      *(undefined8 *)((long)&this->Layers[0].Size + lVar3) = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pvVar2,GImAllocatorUserData);
      *(undefined8 *)((long)&this->Layers[0].Data + lVar3) = 0;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 == 0x10);
  return;
}

Assistant:

void ClearFreeMemory()  { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].clear(); }